

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void get_children(Parser *p,PNode *pn,VecPNode *ps,VecPNode *ps2,VecPNode *ph)

{
  uint32 *puVar1;
  PNode *pPVar2;
  PNode *pPVar3;
  int iVar4;
  ulong uVar5;
  PNode *pn_00;
  
  iVar4 = set_find(ps2,pn);
  if (iVar4 == 0) {
    for (uVar5 = 0; uVar5 < (pn->children).n; uVar5 = uVar5 + 1) {
      pPVar2 = (pn->children).v[uVar5];
      pn_00 = pPVar2->latest;
      while (pPVar3 = pn_00->latest, pn_00 != pPVar3) {
        pPVar3->refcount = pPVar3->refcount + 1;
        puVar1 = &pn_00->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_PNode(p,pn_00);
        }
        pPVar2->latest = pPVar3;
        pn_00 = pPVar3;
      }
      iVar4 = set_add(ps,pn_00);
      if (iVar4 != 0) {
        iVar4 = set_find(ps2,pn_00);
        if (iVar4 == 0) {
          heap_insert(ph,pn_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void get_children(Parser *p, PNode *pn, VecPNode *ps, VecPNode *ps2, VecPNode *ph) {
  uint i;
  if (!set_find(ps2, pn)) {
    for (i = 0; i < pn->children.n; i++) {
      PNode *c = pn->children.v[i];
      LATEST(p, c);
      if (set_add(ps, c)) {
        if (!set_find(ps2, c))
          heap_insert(ph, c);
      }
    }
  }
}